

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void add_parameter_to_current_function(ParserState *parser,LuaSymbolList **list,LuaSymbol *symbol)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)((long)&symbol->field_1 + 0x28);
  *pbVar1 = *pbVar1 | 2;
  raviX_add_symbol(parser->compiler_state,list,symbol);
  add_local_symbol_to_current_scope(parser,symbol);
  return;
}

Assistant:

static void add_parameter_to_current_function(ParserState *parser, LuaSymbolList **list, LuaSymbol *symbol)
{
	symbol->variable.function_parameter = 1;
	raviX_add_symbol(parser->compiler_state, list, symbol);
	add_local_symbol_to_current_scope(parser, symbol);
}